

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.hpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderMaxCombinedTextureUnitsTest::~GeometryShaderMaxCombinedTextureUnitsTest
          (GeometryShaderMaxCombinedTextureUnitsTest *this)

{
  ~GeometryShaderMaxCombinedTextureUnitsTest(this);
  operator_delete(this,0x3f8);
  return;
}

Assistant:

virtual ~GeometryShaderMaxCombinedTextureUnitsTest()
	{
	}